

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.cpp
# Opt level: O1

void __thiscall Triangle::_drawList(Triangle *this)

{
  undefined8 uStack_78;
  float colors [9];
  float local_48;
  float local_44;
  float verts [9];
  
  colors[0] = 0.0;
  colors[1] = 0.0;
  colors[4] = 0.0;
  colors[5] = 0.0;
  uStack_78 = 0x3f800000;
  colors[2] = 1.0;
  colors[3] = 0.0;
  colors[6] = 1.0;
  local_48 = this->x;
  verts[5] = this->y;
  local_44 = verts[5] - this->height;
  verts[0] = this->z;
  verts[1] = local_48 + this->width;
  verts[4] = this->width * 0.5 + local_48;
  verts[2] = local_44;
  verts[3] = verts[0];
  verts[6] = verts[0];
  (*glad_glEnableClientState)(0x8076);
  (*glad_glEnableClientState)(0x8074);
  (*glad_glColorPointer)(3,0x1406,0,&uStack_78);
  (*glad_glVertexPointer)(3,0x1406,0,&local_48);
  (*glad_glDrawArrays)(4,0,3);
  (*glad_glDisableClientState)(0x8074);
  (*glad_glDisableClientState)(0x8076);
  return;
}

Assistant:

void Triangle::_drawList() {
    // Define the vertex arrays 
    float colors[] { 1.0, 0.0, 0.0,
                     0.0, 1.0, 0.0,
                     0.0, 0.0, 1.0 };

    float verts[] = { x,                  y - height, z,   // Bottom Left
                      x + width,          y - height, z,   // Bottom Right
                      x + (width / 2.0f), y,          z }; // Top Center

    // Enable color and vertex array drawing modes
    glEnableClientState(GL_COLOR_ARRAY);
    glEnableClientState(GL_VERTEX_ARRAY);

    // Specify the arrays to use
    glColorPointer(3, GL_FLOAT, 0, colors);
    glVertexPointer(3, GL_FLOAT, 0, verts);

    // Draw the tri
    glDrawArrays(GL_TRIANGLES, 0, 3);

    // Disable color and vertex array drawing modes
    glDisableClientState(GL_VERTEX_ARRAY);
    glDisableClientState(GL_COLOR_ARRAY);
}